

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O2

void __thiscall Js::StepController::ResetReturnedValueList(StepController *this)

{
  ReturnedValueList *pRVar1;
  long lVar2;
  
  this->returnedValueRecordingDepth = 0;
  pRVar1 = this->returnedValueList;
  if ((pRVar1 != (ReturnedValueList *)0x0) &&
     (lVar2 = (long)(pRVar1->
                    super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                    count, lVar2 != 0)) {
    memset((pRVar1->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
           buffer.ptr,0,lVar2 << 3);
    (pRVar1->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count = 0;
  }
  return;
}

Assistant:

void StepController::ResetReturnedValueList()
    {
        returnedValueRecordingDepth = 0;
        if (this->returnedValueList != nullptr)
        {
            this->returnedValueList->ClearAndZero();
        }
    }